

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

int av1_check_fpmt_config(AV1_PRIMARY *ppi,AV1EncoderConfig *oxcf)

{
  RefCntBuffer *pRVar1;
  int iVar2;
  uint uVar3;
  AV1EncoderConfig *in_RSI;
  AV1_PRIMARY *in_RDI;
  int reset_size;
  int cur_gf_index;
  int i;
  int local_28;
  int local_1c;
  int local_4;
  
  iVar2 = is_fpmt_config(in_RDI,in_RSI);
  if (iVar2 == 0) {
    if (1 < in_RDI->num_fp_contexts) {
      for (local_1c = 1; local_1c < in_RDI->num_fp_contexts; local_1c = local_1c + 1) {
        if ((in_RDI->parallel_cpi[local_1c]->common).cur_frame != (RefCntBuffer *)0x0) {
          pRVar1 = (in_RDI->parallel_cpi[local_1c]->common).cur_frame;
          pRVar1->ref_count = pRVar1->ref_count + -1;
          (in_RDI->parallel_cpi[local_1c]->common).cur_frame = (RefCntBuffer *)0x0;
        }
      }
      uVar3 = (uint)in_RDI->cpi->gf_frame_index;
      if ((int)((in_RDI->gf_group).size - uVar3) < 0) {
        local_28 = 0;
      }
      else {
        local_28 = (in_RDI->gf_group).size - uVar3;
      }
      memset((in_RDI->gf_group).frame_parallel_level + (int)uVar3,0,(long)local_28 << 2);
      memset((in_RDI->gf_group).is_frame_non_ref + (int)uVar3,0,(long)local_28);
      memset((in_RDI->gf_group).src_offset + (int)uVar3,0,(long)local_28 << 2);
      memset((in_RDI->gf_group).skip_frame_refresh + (int)uVar3,0xff,(long)local_28 << 5);
      memset((in_RDI->gf_group).skip_frame_as_ref + (int)uVar3,0xff,(long)local_28 << 2);
      in_RDI->num_fp_contexts = 1;
    }
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int av1_check_fpmt_config(AV1_PRIMARY *const ppi,
                          const AV1EncoderConfig *const oxcf) {
  if (is_fpmt_config(ppi, oxcf)) return 1;
  // Reset frame parallel configuration for unsupported config
  if (ppi->num_fp_contexts > 1) {
    for (int i = 1; i < ppi->num_fp_contexts; i++) {
      // Release the previously-used frame-buffer
      if (ppi->parallel_cpi[i]->common.cur_frame != NULL) {
        --ppi->parallel_cpi[i]->common.cur_frame->ref_count;
        ppi->parallel_cpi[i]->common.cur_frame = NULL;
      }
    }

    int cur_gf_index = ppi->cpi->gf_frame_index;
    int reset_size = AOMMAX(0, ppi->gf_group.size - cur_gf_index);
    av1_zero_array(&ppi->gf_group.frame_parallel_level[cur_gf_index],
                   reset_size);
    av1_zero_array(&ppi->gf_group.is_frame_non_ref[cur_gf_index], reset_size);
    av1_zero_array(&ppi->gf_group.src_offset[cur_gf_index], reset_size);
    memset(&ppi->gf_group.skip_frame_refresh[cur_gf_index][0], INVALID_IDX,
           sizeof(ppi->gf_group.skip_frame_refresh[cur_gf_index][0]) *
               reset_size * REF_FRAMES);
    memset(&ppi->gf_group.skip_frame_as_ref[cur_gf_index], INVALID_IDX,
           sizeof(ppi->gf_group.skip_frame_as_ref[cur_gf_index]) * reset_size);
    ppi->num_fp_contexts = 1;
  }
  return 0;
}